

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_save(void)

{
  wchar_t w_00;
  wchar_t h_00;
  term_win *s;
  term_win *mem;
  wchar_t h;
  wchar_t w;
  
  w_00 = Term->wid;
  h_00 = Term->hgt;
  s = (term_win *)mem_zalloc(0x60);
  term_win_init(s,w_00,h_00);
  term_win_copy(s,Term->scr,w_00,h_00);
  s->next = Term->mem;
  Term->mem = s;
  Term->saved = Term->saved + '\x01';
  return 0;
}

Assistant:

errr Term_save(void)
{
	int w = Term->wid;
	int h = Term->hgt;

	term_win *mem;

	/* Allocate window */
	mem = mem_zalloc(sizeof(term_win));

	/* Initialize window */
	term_win_init(mem, w, h);

	/* Grab */
	term_win_copy(mem, Term->scr, w, h);

	/* Front of the queue */
	mem->next = Term->mem;
	Term->mem = mem;

	/* One more saved */
	Term->saved++;

	/* Success */
	return (0);
}